

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O2

void __thiscall QNetworkProxy::setCapabilities(QNetworkProxy *this,Capabilities capabilities)

{
  QNetworkProxyPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QNetworkProxyPrivate>::operator->(&this->d);
  (pQVar1->capabilities).super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
  super_QFlagsStorage<QNetworkProxy::Capability>.i =
       (Int)capabilities.super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
            super_QFlagsStorage<QNetworkProxy::Capability>.i;
  pQVar1 = QSharedDataPointer<QNetworkProxyPrivate>::operator->(&this->d);
  pQVar1->capabilitiesSet = true;
  return;
}

Assistant:

void QNetworkProxy::setCapabilities(Capabilities capabilities)
{
    d->capabilities = capabilities;
    d->capabilitiesSet = true;
}